

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigWnd.c
# Opt level: O0

void Saig_ManWindowCreatePis(Aig_Man_t *pNew,Aig_Man_t *p0,Aig_Man_t *p1,Vec_Ptr_t *vNodes0)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  int local_44;
  int Counter;
  int i;
  Aig_Obj_t *pFanin;
  Aig_Obj_t *pMatch;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vNodes0_local;
  Aig_Man_t *p1_local;
  Aig_Man_t *p0_local;
  Aig_Man_t *pNew_local;
  
  local_44 = 0;
  do {
    iVar1 = Vec_PtrSize(vNodes0);
    if (iVar1 <= local_44) {
      return;
    }
    pAVar2 = (Aig_Obj_t *)Vec_PtrEntry(vNodes0,local_44);
    iVar1 = Saig_ObjIsLo(p0,pAVar2);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsNode(pAVar2);
      if (iVar1 == 0) {
        __assert_fail("Aig_ObjIsNode(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                      ,0x265,
                      "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                     );
      }
      pAVar3 = Aig_ObjFanin0(pAVar2);
      iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar3);
      if ((iVar1 == 0) && ((pAVar3->field_5).pData == (void *)0x0)) {
        pAVar4 = Aig_ObjCreateCi(pNew);
        (pAVar3->field_5).pData = pAVar4;
        pAVar4 = Aig_ObjRepr(p0,pAVar3);
        pAVar5 = Aig_ObjRepr(p1,pAVar4);
        if (pAVar3 != pAVar5) {
          __assert_fail("pFanin == Aig_ObjRepr( p1, pMatch )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x26b,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        if (pAVar4 == (Aig_Obj_t *)0x0) {
          __assert_fail("pMatch != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x26c,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        pAVar4->field_5 = pAVar3->field_5;
      }
      pAVar2 = Aig_ObjFanin1(pAVar2);
      iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar2);
      if ((iVar1 == 0) && ((pAVar2->field_5).pData == (void *)0x0)) {
        pAVar3 = Aig_ObjCreateCi(pNew);
        (pAVar2->field_5).pData = pAVar3;
        pAVar3 = Aig_ObjRepr(p0,pAVar2);
        pAVar4 = Aig_ObjRepr(p1,pAVar3);
        if (pAVar2 != pAVar4) {
          __assert_fail("pFanin == Aig_ObjRepr( p1, pMatch )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x275,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        if (pAVar3 == (Aig_Obj_t *)0x0) {
          __assert_fail("pMatch != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x276,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        pAVar3->field_5 = pAVar2->field_5;
      }
    }
    else {
      pAVar2 = Saig_ObjLoToLi(p0,pAVar2);
      pAVar2 = Aig_ObjFanin0(pAVar2);
      iVar1 = Aig_ObjIsTravIdCurrent(p0,pAVar2);
      if ((iVar1 == 0) && ((pAVar2->field_5).pData == (void *)0x0)) {
        pAVar3 = Aig_ObjCreateCi(pNew);
        (pAVar2->field_5).pData = pAVar3;
        pAVar3 = Aig_ObjRepr(p0,pAVar2);
        pAVar4 = Aig_ObjRepr(p1,pAVar3);
        if (pAVar2 != pAVar4) {
          __assert_fail("pFanin == Aig_ObjRepr( p1, pMatch )",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x25d,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        if (pAVar3 == (Aig_Obj_t *)0x0) {
          __assert_fail("pMatch != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigWnd.c"
                        ,0x25e,
                        "void Saig_ManWindowCreatePis(Aig_Man_t *, Aig_Man_t *, Aig_Man_t *, Vec_Ptr_t *)"
                       );
        }
        pAVar3->field_5 = pAVar2->field_5;
      }
    }
    local_44 = local_44 + 1;
  } while( true );
}

Assistant:

void Saig_ManWindowCreatePis( Aig_Man_t * pNew, Aig_Man_t * p0, Aig_Man_t * p1, Vec_Ptr_t * vNodes0 )
{
    Aig_Obj_t * pObj, * pMatch, * pFanin;
    int i, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes0, pObj, i )
    {
        if ( Saig_ObjIsLo(p0, pObj) )
        {
            pMatch = Saig_ObjLoToLi( p0, pObj );
            pFanin = Aig_ObjFanin0(pMatch);
            if ( !Aig_ObjIsTravIdCurrent(p0, pFanin) && pFanin->pData == NULL )
            {
                pFanin->pData = Aig_ObjCreateCi(pNew);
                pMatch = Aig_ObjRepr( p0, pFanin );
                assert( pFanin == Aig_ObjRepr( p1, pMatch ) );
                assert( pMatch != NULL );
                pMatch->pData = pFanin->pData;
                Counter++;
            }
        }
        else
        {
            assert( Aig_ObjIsNode(pObj) );
            pFanin = Aig_ObjFanin0(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p0, pFanin) && pFanin->pData == NULL )
            {
                pFanin->pData = Aig_ObjCreateCi(pNew);
                pMatch = Aig_ObjRepr( p0, pFanin );
                assert( pFanin == Aig_ObjRepr( p1, pMatch ) );
                assert( pMatch != NULL );
                pMatch->pData = pFanin->pData;
                Counter++;
            }
            pFanin = Aig_ObjFanin1(pObj);
            if ( !Aig_ObjIsTravIdCurrent(p0, pFanin) && pFanin->pData == NULL )
            {
                pFanin->pData = Aig_ObjCreateCi(pNew);
                pMatch = Aig_ObjRepr( p0, pFanin );
                assert( pFanin == Aig_ObjRepr( p1, pMatch ) );
                assert( pMatch != NULL );
                pMatch->pData = pFanin->pData;
                Counter++;
            }
        }
    }
//    printf( "Added %d primary inputs.\n", Counter );
}